

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment_two_pass.cpp
# Opt level: O3

void BrotliCompressFragmentTwoPassImpl13
               (BrotliTwoPassArena *s,uint8_t *input,size_t input_size,int is_last,
               uint32_t *command_buf,uint8_t *literal_buf,int *table,size_t *storage_ix,
               uint8_t *storage)

{
  long *plVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint8_t *s1_orig;
  uint8_t *puVar5;
  long lVar6;
  uint8_t *puVar7;
  byte bVar8;
  undefined4 in_register_0000000c;
  uint32_t *commands;
  int *piVar9;
  uint8_t *puVar10;
  int iVar11;
  long *input_00;
  ulong uVar12;
  size_t input_size_00;
  ulong uVar13;
  long *__src;
  long *plVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  uint uVar18;
  long *plVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  long *plVar23;
  bool bVar24;
  uint *local_98;
  uint32_t *local_90;
  
  commands = (uint32_t *)CONCAT44(in_register_0000000c,is_last);
  input_00 = (long *)input;
  if (input_size != 0) {
    do {
      input_size_00 = 0x20000;
      if (input_size < 0x20000) {
        input_size_00 = input_size;
      }
      plVar1 = (long *)((long)input_00 + input_size_00);
      __src = input_00;
      local_90 = command_buf;
      local_98 = commands;
      if (0xf < input_size) {
        uVar13 = input_size - 0x10;
        if (input_size_00 - 4 < input_size - 0x10) {
          uVar13 = input_size_00 - 4;
        }
        plVar23 = (long *)(uVar13 + (long)input_00);
        uVar13 = 0xffffffff;
LAB_01142b76:
        lVar17 = *(long *)((long)__src + 1);
        iVar16 = (int)uVar13;
        uVar15 = 0x20;
        plVar14 = (long *)((long)__src + 1);
        do {
          plVar19 = (long *)((ulong)(uVar15 >> 5) + (long)plVar14);
          if (plVar23 < plVar19) break;
          uVar21 = (ulong)(lVar17 * 0x1e35a7bd00000000) >> 0x33;
          lVar17 = *plVar19;
          iVar11 = (int)plVar14;
          iVar22 = (int)input;
          if (((int)*plVar14 == *(int *)((long)plVar14 + -(long)iVar16)) && (0 < iVar16)) {
            puVar5 = (uint8_t *)((long)plVar14 + -(long)iVar16);
            *(int *)(literal_buf + uVar21 * 4) = iVar11 - iVar22;
LAB_01142bec:
            uVar21 = (long)plVar14 - (long)puVar5;
            if ((long)uVar21 < 0x3fff1) goto LAB_01142c02;
          }
          else {
            iVar2 = *(int *)(literal_buf + uVar21 * 4);
            *(int *)(literal_buf + uVar21 * 4) = iVar11 - iVar22;
            if ((int)*plVar14 == *(int *)(input + iVar2)) {
              puVar5 = input + iVar2;
              goto LAB_01142bec;
            }
          }
          uVar15 = uVar15 + 1;
          plVar14 = plVar19;
        } while( true );
      }
LAB_011430f0:
      if (__src < plVar1) {
        uVar15 = (uint)((long)plVar1 - (long)__src);
        if (5 < uVar15) {
          if (uVar15 < 0x82) {
            uVar15 = uVar15 - 2;
            uVar3 = 0x1f;
            if (uVar15 != 0) {
              for (; uVar15 >> uVar3 == 0; uVar3 = uVar3 - 1) {
              }
            }
            bVar8 = (char)(uVar3 ^ 0xffffffe0) + 0x1f;
            uVar4 = uVar15 >> (bVar8 & 0x1f);
            uVar15 = (uVar15 - (uVar4 << (bVar8 & 0x1f))) * 0x100 |
                     uVar4 + (uVar3 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (uVar15 < 0x842) {
            uVar3 = 0x1f;
            if (uVar15 - 0x42 != 0) {
              for (; uVar15 - 0x42 >> uVar3 == 0; uVar3 = uVar3 - 1) {
              }
            }
            uVar15 = (((-1 << ((byte)uVar3 & 0x1f)) + uVar15 + -0x42) * 0x100 - (uVar3 ^ 0x1f)) +
                     0x29;
          }
          else {
            iVar16 = uVar15 * 0x100;
            if (uVar15 < 0x1842) {
              uVar15 = iVar16 - 0x841eb;
            }
            else if (uVar15 < 0x5842) {
              uVar15 = iVar16 - 0x1841ea;
            }
            else {
              uVar15 = iVar16 - 0x5841e9;
            }
          }
        }
        *local_98 = uVar15;
        local_98 = local_98 + 1;
        uVar13 = (long)plVar1 - (long)__src & 0xffffffff;
        switchD_00b03519::default(local_90,__src,uVar13);
        local_90 = (uint32_t *)((long)local_90 + uVar13);
      }
      iVar16 = ShouldCompress(s,(uint8_t *)input_00,input_size_00,(long)local_90 - (long)command_buf
                             );
      if (iVar16 == 0) {
        BrotliStoreMetaBlockHeader(input_size_00,1,(size_t *)table,(uint8_t *)storage_ix);
        iVar16 = *table;
        *(ulong *)table = (ulong)(iVar16 + 7U & 0xfffffff8);
        switchD_00b03519::default
                  ((void *)((ulong)(iVar16 + 7U >> 3) + (long)storage_ix),input_00,input_size_00);
        uVar13 = input_size_00 * 8 + *(long *)table;
        *(ulong *)table = uVar13;
        *(undefined1 *)((long)storage_ix + (uVar13 >> 3)) = 0;
      }
      else {
        BrotliStoreMetaBlockHeader(input_size_00,0,(size_t *)table,(uint8_t *)storage_ix);
        uVar13 = *(ulong *)table;
        uVar21 = uVar13 >> 3;
        *(ulong *)((long)storage_ix + uVar21) = (ulong)*(byte *)((long)storage_ix + uVar21);
        *(ulong *)table = uVar13 + 0xd;
        StoreCommands(s,(uint8_t *)command_buf,(long)local_90 - (long)command_buf,commands,
                      (long)local_98 - (long)commands >> 2,(size_t *)table,(uint8_t *)storage_ix);
      }
      input_size = input_size - input_size_00;
      input_00 = plVar1;
    } while (input_size != 0);
  }
  return;
LAB_01142c02:
  puVar5 = puVar5 + 4;
  piVar9 = (int *)((long)plVar14 + 4);
  uVar12 = (long)plVar1 + (-4 - (long)plVar14);
  puVar10 = puVar5;
  if (7 < uVar12) {
    lVar17 = 0;
LAB_01142c1a:
    if (*(ulong *)((long)piVar9 + lVar17) == *(ulong *)(puVar5 + lVar17)) goto code_r0x01142c27;
    uVar20 = *(ulong *)(puVar5 + lVar17) ^ *(ulong *)((long)piVar9 + lVar17);
    uVar12 = 0;
    if (uVar20 != 0) {
      for (; (uVar20 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
      }
    }
    lVar17 = (uVar12 >> 3 & 0x1fffffff) + lVar17;
    goto LAB_01142c7a;
  }
LAB_01142c41:
  puVar7 = puVar10;
  if (uVar12 != 0) {
    puVar7 = puVar10 + uVar12;
    uVar20 = 0;
    do {
      if (puVar10[uVar20] != *(uint8_t *)((long)piVar9 + uVar20)) {
        puVar7 = puVar10 + uVar20;
        break;
      }
      uVar20 = uVar20 + 1;
    } while (uVar12 != uVar20);
  }
  lVar17 = (long)puVar7 - (long)puVar5;
LAB_01142c7a:
  uVar3 = iVar11 - (int)__src;
  uVar15 = uVar3;
  if (5 < uVar3) {
    if (uVar3 < 0x82) {
      uVar4 = uVar3 - 2;
      uVar15 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> uVar15 == 0; uVar15 = uVar15 - 1) {
        }
      }
      bVar8 = (char)(uVar15 ^ 0xffffffe0) + 0x1f;
      uVar18 = uVar4 >> (bVar8 & 0x1f);
      uVar15 = (uVar4 - (uVar18 << (bVar8 & 0x1f))) * 0x100 |
               uVar18 + (uVar15 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (uVar3 < 0x842) {
      uVar15 = 0x1f;
      if (uVar3 - 0x42 != 0) {
        for (; uVar3 - 0x42 >> uVar15 == 0; uVar15 = uVar15 - 1) {
        }
      }
      uVar15 = (((-1 << ((byte)uVar15 & 0x1f)) + uVar3 + -0x42) * 0x100 - (uVar15 ^ 0x1f)) + 0x29;
    }
    else {
      iVar11 = uVar3 * 0x100;
      if (uVar3 < 0x1842) {
        uVar15 = iVar11 - 0x841eb;
      }
      else if (uVar3 < 0x5842) {
        uVar15 = iVar11 - 0x1841ea;
      }
      else {
        uVar15 = iVar11 - 0x5841e9;
      }
    }
  }
  *local_98 = uVar15;
  switchD_00b03519::default(local_90,__src,(long)(int)uVar3);
  uVar15 = 0x40;
  if (iVar16 != (int)uVar21) {
    uVar4 = (int)uVar21 + 3;
    uVar15 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar15 == 0; uVar15 = uVar15 - 1) {
      }
    }
    bVar8 = 0x1e - (char)(uVar15 ^ 0x1f);
    bVar24 = (uVar4 >> (bVar8 & 0x1f) & 1) != 0;
    uVar15 = (uint)bVar24 +
             ((uVar4 - (bVar24 + 2 << (bVar8 & 0x1f))) * 0x100 | (uVar15 ^ 0x1f) * 2 ^ 0x3e) + 0x4c;
    uVar13 = uVar21 & 0xffffffff;
  }
  uVar21 = lVar17 + 4;
  local_98[1] = uVar15;
  if (uVar21 < 0xc) {
    local_98[2] = (int)uVar21 + 0x14;
    lVar6 = 0xc;
  }
  else if (uVar21 < 0x48) {
    uVar15 = 0x1f;
    uVar4 = (uint)(lVar17 - 4U);
    if (uVar4 != 0) {
      for (; uVar4 >> uVar15 == 0; uVar15 = uVar15 - 1) {
      }
    }
    bVar8 = (char)(uVar15 ^ 0xffffffe0) + 0x1f;
    iVar16 = (int)(lVar17 - 4U >> (bVar8 & 0x3f));
    local_98[2] = (uVar4 - (iVar16 << (bVar8 & 0x1f))) * 0x100 |
                  iVar16 + (uVar15 ^ 0xffffffe0) * 2 + 0x5a;
    lVar6 = 0xc;
  }
  else if (uVar21 < 0x88) {
    local_98[2] = ((uint)(lVar17 - 4U) & 0x1f) << 8 | (int)(lVar17 - 4U >> 5) + 0x36U;
    local_98[3] = 0x40;
    lVar6 = 0x10;
  }
  else {
    if (uVar21 < 0x848) {
      uVar15 = (int)lVar17 - 0x44;
      iVar16 = 0x1f;
      if (uVar15 != 0) {
        for (; uVar15 >> iVar16 == 0; iVar16 = iVar16 + -1) {
        }
      }
      local_98[2] = ((int)(-1L << ((byte)iVar16 & 0x3f)) + (int)lVar17 + -0x44) * 0x100 + iVar16 +
                    0x34;
    }
    else {
      local_98[2] = (int)uVar21 * 0x100 - 0x847c1;
    }
    local_98[3] = 0x40;
    lVar6 = 0x10;
  }
  __src = (long *)((long)plVar14 + lVar17 + 4);
  local_90 = (uint32_t *)((long)local_90 + (long)(int)uVar3);
  local_98 = (uint *)((long)local_98 + lVar6);
  if (plVar23 <= __src) goto LAB_011430f0;
  uVar21 = *(ulong *)((long)plVar14 + lVar17 + 1);
  uVar12 = (uVar21 & 0xffffffff000000) * 0x1e35a7bd00 >> 0x33;
  iVar16 = (int)__src - iVar22;
  *(int *)(literal_buf + ((uVar21 & 0xffffffff00) * 0x1e35a7bd000000 >> 0x33) * 4) = iVar16 + -2;
  *(int *)(literal_buf + (uVar21 * 0x1e35a7bd00000000 >> 0x33) * 4) = iVar16 + -1;
  lVar17 = (long)*(int *)(literal_buf + uVar12 * 4);
  *(int *)(literal_buf + uVar12 * 4) = iVar16;
  uVar21 = (long)__src - (long)(input + lVar17);
  if (((long)uVar21 < 0x3fff1) && (plVar14 = __src, (int)*__src == *(int *)(input + lVar17))) {
LAB_01142e6e:
    uVar13 = uVar21;
    puVar10 = input + lVar17 + 4;
    piVar9 = (int *)((long)plVar14 + 4);
    uVar21 = (long)plVar1 + (-4 - (long)plVar14);
    puVar5 = puVar10;
    if (7 < uVar21) {
      lVar17 = 0;
LAB_01142e89:
      if (*(ulong *)((long)piVar9 + lVar17) == *(ulong *)(puVar10 + lVar17)) goto code_r0x01142e96;
      uVar12 = *(ulong *)(puVar10 + lVar17) ^ *(ulong *)((long)piVar9 + lVar17);
      uVar21 = 0;
      if (uVar12 != 0) {
        for (; (uVar12 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
        }
      }
      lVar17 = (uVar21 >> 3 & 0x1fffffff) + lVar17;
      goto LAB_01142ee8;
    }
    goto LAB_01142eb0;
  }
  goto LAB_01142b76;
code_r0x01142c27:
  uVar12 = uVar12 - 8;
  lVar17 = lVar17 + 8;
  if (uVar12 < 8) goto code_r0x01142c35;
  goto LAB_01142c1a;
code_r0x01142c35:
  piVar9 = (int *)((long)piVar9 + lVar17);
  puVar10 = puVar5 + lVar17;
  goto LAB_01142c41;
code_r0x01142e96:
  uVar21 = uVar21 - 8;
  lVar17 = lVar17 + 8;
  if (uVar21 < 8) goto code_r0x01142ea4;
  goto LAB_01142e89;
code_r0x01142ea4:
  piVar9 = (int *)((long)piVar9 + lVar17);
  puVar5 = puVar10 + lVar17;
LAB_01142eb0:
  puVar7 = puVar5;
  if (uVar21 != 0) {
    puVar7 = puVar5 + uVar21;
    uVar12 = 0;
    do {
      if (puVar5[uVar12] != *(uint8_t *)((long)piVar9 + uVar12)) {
        puVar7 = puVar5 + uVar12;
        break;
      }
      uVar12 = uVar12 + 1;
    } while (uVar21 != uVar12);
  }
  lVar17 = (long)puVar7 - (long)puVar10;
LAB_01142ee8:
  uVar21 = lVar17 + 4;
  if (uVar21 < 10) {
    uVar15 = (int)uVar21 + 0x26;
  }
  else if (uVar21 < 0x86) {
    uVar15 = 0x1f;
    uVar3 = (uint)(lVar17 - 2U);
    if (uVar3 != 0) {
      for (; uVar3 >> uVar15 == 0; uVar15 = uVar15 - 1) {
      }
    }
    bVar8 = (char)(uVar15 ^ 0xffffffe0) + 0x1f;
    iVar16 = (int)(lVar17 - 2U >> (bVar8 & 0x3f));
    uVar15 = (uVar3 - (iVar16 << (bVar8 & 0x1f))) * 0x100 |
             iVar16 + (uVar15 ^ 0xffffffe0) * 2 + 0x6a;
  }
  else if (uVar21 < 0x846) {
    uVar15 = (int)lVar17 - 0x42;
    iVar16 = 0x1f;
    if (uVar15 != 0) {
      for (; uVar15 >> iVar16 == 0; iVar16 = iVar16 + -1) {
      }
    }
    uVar15 = ((int)(-1L << ((byte)iVar16 & 0x3f)) + (int)lVar17 + -0x42) * 0x100 + iVar16 + 0x34;
  }
  else {
    uVar15 = (int)uVar21 * 0x100 - 0x845c1;
  }
  __src = (long *)((long)plVar14 + lVar17 + 4);
  *local_98 = uVar15;
  uVar3 = (int)uVar13 + 3;
  uVar15 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> uVar15 == 0; uVar15 = uVar15 - 1) {
    }
  }
  bVar8 = 0x1e - (char)(uVar15 ^ 0x1f);
  bVar24 = (uVar3 >> (bVar8 & 0x1f) & 1) != 0;
  local_98[1] = ((uVar3 - (bVar24 + 2 << (bVar8 & 0x1f))) * 0x100 | (uVar15 ^ 0x1f) * 2 ^ 0x3e) +
                (uint)bVar24 + 0x4c;
  local_98 = local_98 + 2;
  if (plVar23 <= __src) goto LAB_011430f0;
  uVar21 = *(ulong *)((long)plVar14 + lVar17 + 1);
  uVar12 = (uVar21 & 0xffffffff000000) * 0x1e35a7bd00 >> 0x33;
  iVar16 = (int)__src - iVar22;
  *(int *)(literal_buf + (uVar21 * 0x1e35a7bd00000000 >> 0x33) * 4) = iVar16 + -3;
  *(int *)(literal_buf + ((uVar21 & 0xffffffff00) * 0x1e35a7bd000000 >> 0x33) * 4) = iVar16 + -2;
  *(int *)(literal_buf + ((uVar21 & 0xffffffff0000) * 0x1e35a7bd0000 >> 0x33) * 4) = iVar16 + -1;
  lVar17 = (long)*(int *)(literal_buf + uVar12 * 4);
  *(int *)(literal_buf + uVar12 * 4) = iVar16;
  uVar21 = (long)__src - (long)(input + lVar17);
  if ((0x3fff0 < (long)uVar21) || (plVar14 = __src, (int)*__src != *(int *)(input + lVar17)))
  goto LAB_01142b76;
  goto LAB_01142e6e;
}

Assistant:

void duckdb_brotli::BrotliCompressFragmentTwoPass(
    BrotliTwoPassArena* s, const uint8_t* input, size_t input_size,
    BROTLI_BOOL is_last, uint32_t* command_buf, uint8_t* literal_buf,
    int* table, size_t table_size, size_t* storage_ix, uint8_t* storage) {
  const size_t initial_storage_ix = *storage_ix;
  const size_t table_bits = Log2FloorNonZero(table_size);
  switch (table_bits) {
#define CASE_(B)                                      \
    case B:                                           \
      BrotliCompressFragmentTwoPassImpl ## B(         \
          s, input, input_size, is_last, command_buf, \
          literal_buf, table, storage_ix, storage);   \
      break;
    FOR_TABLE_BITS_(CASE_)
#undef CASE_
    default: BROTLI_DCHECK(0); break;
  }

  /* If output is larger than single uncompressed block, rewrite it. */
  if (*storage_ix - initial_storage_ix > 31 + (input_size << 3)) {
    RewindBitPosition(initial_storage_ix, storage_ix, storage);
    EmitUncompressedMetaBlock(input, input_size, storage_ix, storage);
  }

  if (is_last) {
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    *storage_ix = (*storage_ix + 7u) & ~7u;
  }
}